

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O3

void __thiscall
t_javame_generator::generate_service_client(t_javame_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *os;
  int *piVar1;
  undefined **ppuVar2;
  pointer pcVar3;
  t_struct *ptVar4;
  t_type *returntype;
  bool bVar5;
  int iVar6;
  long *plVar7;
  ostream *poVar8;
  pointer pptVar9;
  t_function *ptVar10;
  undefined **ppuVar11;
  size_type *psVar12;
  char *pcVar13;
  t_javame_generator *this_00;
  char *__end;
  pointer pptVar14;
  string resultname;
  t_struct noargs;
  string argsname;
  string funname;
  string extends;
  string extends_client;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  t_function recv_function;
  t_function send_function;
  string local_558;
  t_struct *local_538;
  string local_530;
  string local_510;
  string local_4f0;
  undefined1 local_4d0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_4b8;
  bool local_4a8;
  _Rb_tree_node_base local_498;
  size_t local_478;
  t_program *local_470;
  _Alloc_hider local_468;
  size_type local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  pointer local_448;
  pointer pptStack_440;
  pointer local_438;
  pointer pptStack_430;
  pointer local_428;
  undefined7 uStack_420;
  undefined4 uStack_419;
  int local_414;
  bool local_410;
  string local_408;
  char *local_3e8;
  long local_3e0;
  char local_3d8 [16];
  char *local_3c8;
  long local_3c0;
  char local_3b8 [16];
  size_type *local_3a8;
  pointer local_3a0;
  undefined1 local_398;
  undefined7 uStack_397;
  undefined8 uStack_390;
  string local_388;
  string local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  string local_328;
  char *local_308;
  long local_300;
  char local_2f8 [16];
  vector<t_function_*,_std::allocator<t_function_*>_> local_2e8;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  t_function local_170;
  t_function local_d0;
  
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"","");
  local_308 = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"","");
  if (tservice->extends_ != (t_service *)0x0) {
    type_name_abi_cxx11_
              ((string *)local_4d0,this,&tservice->extends_->super_t_type,false,false,false);
    std::__cxx11::string::operator=((string *)&local_348,(string *)local_4d0);
    ppuVar2 = (undefined **)(local_4d0 + 0x10);
    if ((undefined **)local_4d0._0_8_ != ppuVar2) {
      operator_delete((void *)local_4d0._0_8_);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0,
                   " extends ",&local_348);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
    ppuVar11 = (undefined **)(plVar7 + 2);
    if ((undefined **)*plVar7 == ppuVar11) {
      local_4d0._16_8_ = *ppuVar11;
      aStack_4b8._M_allocated_capacity = plVar7[3];
      local_4d0._0_8_ = ppuVar2;
    }
    else {
      local_4d0._16_8_ = *ppuVar11;
      local_4d0._0_8_ = (undefined **)*plVar7;
    }
    local_4d0._8_8_ = plVar7[1];
    *plVar7 = (long)ppuVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_308,(string *)local_4d0);
    if ((undefined **)local_4d0._0_8_ != ppuVar2) {
      operator_delete((void *)local_4d0._0_8_);
    }
    if (local_d0.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_d0.super_t_doc.doc_._M_string_length) {
      operator_delete(local_d0.super_t_doc._vptr_t_doc);
    }
  }
  os = &this->f_service_;
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"public static class Client",0x1a);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_308,local_300);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8," implements TServiceClient, Iface {",0x23);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"public Client(TProtocol prot)",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)os);
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"this(prot, prot);",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"public Client(TProtocol iprot, TProtocol oprot)",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)os);
  if (local_348._M_string_length == 0) {
    t_generator::indent_abi_cxx11_((string *)local_4d0,(t_generator *)this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,(char *)local_4d0._0_8_,local_4d0._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"iprot_ = iprot;",0xf);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_((string *)&local_d0,(t_generator *)this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(char *)local_d0.super_t_doc._vptr_t_doc,
                        (long)local_d0.super_t_doc.doc_._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"oprot_ = oprot;",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (local_d0.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_d0.super_t_doc.doc_._M_string_length) {
      operator_delete(local_d0.super_t_doc._vptr_t_doc);
    }
  }
  else {
    t_generator::indent_abi_cxx11_((string *)local_4d0,(t_generator *)this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,(char *)local_4d0._0_8_,local_4d0._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"super(iprot, oprot);",0x14);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
    operator_delete((void *)local_4d0._0_8_);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_348._M_string_length == 0) {
    t_generator::indent_abi_cxx11_((string *)local_4d0,(t_generator *)this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,(char *)local_4d0._0_8_,local_4d0._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"protected TProtocol iprot_;",0x1b);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_((string *)&local_d0,(t_generator *)this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(char *)local_d0.super_t_doc._vptr_t_doc,
                        (long)local_d0.super_t_doc.doc_._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"protected TProtocol oprot_;",0x1b);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_((string *)&local_170,(t_generator *)this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(char *)local_170.super_t_doc._vptr_t_doc,
                        (long)local_170.super_t_doc.doc_._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"protected int seqid_;",0x15);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (local_170.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_170.super_t_doc.doc_._M_string_length) {
      operator_delete(local_170.super_t_doc._vptr_t_doc);
    }
    if (local_d0.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_d0.super_t_doc.doc_._M_string_length) {
      operator_delete(local_d0.super_t_doc._vptr_t_doc);
    }
    if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
      operator_delete((void *)local_4d0._0_8_);
    }
    poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"public TProtocol getInputProtocol()",0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)os);
    poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return this.iprot_;",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"public TProtocol getOutputProtocol()",0x24);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)os);
    poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return this.oprot_;",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_2e8,&tservice->functions_)
  ;
  if (local_2e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_2e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar9 = local_2e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_3c8 = local_3b8;
      pcVar3 = ((*pptVar9)->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3c8,pcVar3,pcVar3 + ((*pptVar9)->name_)._M_string_length);
      poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"public ",7);
      ptVar10 = *pptVar9;
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"");
      function_signature((string *)local_4d0,this,ptVar10,&local_328);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(char *)local_4d0._0_8_,local_4d0._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
        operator_delete((void *)local_4d0._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)os);
      poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"send_",5);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_3c8,local_3c0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(",1);
      local_538 = (*pptVar9)->arglist_;
      pptVar14 = (local_538->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (pptVar14 !=
          (local_538->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar5 = true;
        do {
          if (!bVar5) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,", ",2);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)os,((*pptVar14)->name_)._M_dataplus._M_p,
                     ((*pptVar14)->name_)._M_string_length);
          pptVar14 = pptVar14 + 1;
          bVar5 = false;
        } while (pptVar14 !=
                 (local_538->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                );
      if ((*pptVar9)->oneway_ == false) {
        t_generator::indent_abi_cxx11_((string *)local_4d0,(t_generator *)this);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)os,(char *)local_4d0._0_8_,local_4d0._8_8_);
        if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
          operator_delete((void *)local_4d0._0_8_);
        }
        iVar6 = (*((*pptVar9)->returntype_->super_t_doc)._vptr_t_doc[4])();
        if ((char)iVar6 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"return ",7);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"recv_",5);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)os,local_3c8,local_3c0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"();",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)os);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                );
      returntype = g_type_void;
      local_4d0._0_8_ = local_4d0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"send_","");
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_4d0,(ulong)((*pptVar9)->name_)._M_dataplus._M_p);
      local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
      psVar12 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_368.field_2._M_allocated_capacity = *psVar12;
        local_368.field_2._8_8_ = plVar7[3];
      }
      else {
        local_368.field_2._M_allocated_capacity = *psVar12;
        local_368._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_368._M_string_length = plVar7[1];
      *plVar7 = (long)psVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      t_function::t_function(&local_d0,returntype,&local_368,(*pptVar9)->arglist_,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        operator_delete(local_368._M_dataplus._M_p);
      }
      if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
        operator_delete((void *)local_4d0._0_8_);
      }
      local_3e8 = local_3d8;
      pcVar3 = ((*pptVar9)->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3e8,pcVar3,pcVar3 + ((*pptVar9)->name_)._M_string_length);
      std::__cxx11::string::append((char *)&local_3e8);
      poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"public ",7);
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"");
      function_signature((string *)local_4d0,this,&local_d0,&local_190);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(char *)local_4d0._0_8_,local_4d0._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
        operator_delete((void *)local_4d0._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)os);
      t_generator::indent_abi_cxx11_((string *)local_4d0,(t_generator *)this);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,(char *)local_4d0._0_8_,local_4d0._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"oprot_.writeMessageBegin(new TMessage(\"",0x27);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_3c8,local_3c0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\", ",3);
      pcVar13 = "TMessageType.CALL";
      if ((*pptVar9)->oneway_ != false) {
        pcVar13 = "TMessageType.ONEWAY";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,pcVar13,(ulong)(*pptVar9)->oneway_ * 2 + 0x11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ++seqid_));",0xd);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_((string *)&local_170,(t_generator *)this);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(char *)local_170.super_t_doc._vptr_t_doc,
                          (long)local_170.super_t_doc.doc_._M_dataplus._M_p);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_3e8,local_3e0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," args = new ",0xc);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_3e8,local_3e0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"();",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if (local_170.super_t_doc._vptr_t_doc !=
          (_func_int **)&local_170.super_t_doc.doc_._M_string_length) {
        operator_delete(local_170.super_t_doc._vptr_t_doc);
      }
      if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
        operator_delete((void *)local_4d0._0_8_);
      }
      for (pptVar14 = (local_538->members_).
                      super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
          pptVar14 !=
          (local_538->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar14 = pptVar14 + 1) {
        t_generator::indent_abi_cxx11_((string *)local_4d0,(t_generator *)this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)os,(char *)local_4d0._0_8_,local_4d0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"args.set",8);
        pcVar3 = ((*pptVar14)->name_)._M_dataplus._M_p;
        local_3a8 = (size_type *)&local_398;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3a8,pcVar3,pcVar3 + ((*pptVar14)->name_)._M_string_length);
        psVar12 = local_3a8;
        iVar6 = toupper((int)(char)*local_3a8);
        *(char *)psVar12 = (char)iVar6;
        pcVar3 = local_3a0;
        if (local_3a8 == (size_type *)&local_398) {
          local_170.super_t_doc.doc_.field_2._0_8_ = uStack_390;
          local_3a8 = &local_170.super_t_doc.doc_._M_string_length;
        }
        local_170.super_t_doc.doc_._M_string_length = CONCAT71(uStack_397,local_398);
        local_170.super_t_doc.doc_._M_dataplus._M_p = local_3a0;
        local_3a0 = (pointer)0x0;
        local_398 = 0;
        local_170.super_t_doc._vptr_t_doc = (_func_int **)local_3a8;
        local_3a8 = (size_type *)&local_398;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(char *)local_170.super_t_doc._vptr_t_doc,(long)pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(",1);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,((*pptVar14)->name_)._M_dataplus._M_p,
                            ((*pptVar14)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,");",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if (local_170.super_t_doc._vptr_t_doc !=
            (_func_int **)&local_170.super_t_doc.doc_._M_string_length) {
          operator_delete(local_170.super_t_doc._vptr_t_doc);
        }
        if (local_3a8 != (size_type *)&local_398) {
          operator_delete(local_3a8);
        }
        if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
          operator_delete((void *)local_4d0._0_8_);
        }
      }
      t_generator::indent_abi_cxx11_((string *)local_4d0,(t_generator *)this);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,(char *)local_4d0._0_8_,local_4d0._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"args.write(oprot_);",0x13);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_((string *)&local_170,(t_generator *)this);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(char *)local_170.super_t_doc._vptr_t_doc,
                          (long)local_170.super_t_doc.doc_._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"oprot_.writeMessageEnd();",0x19);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_4f0,(t_generator *)this);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"oprot_.getTransport().flush();",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
        operator_delete(local_4f0._M_dataplus._M_p);
      }
      if (local_170.super_t_doc._vptr_t_doc !=
          (_func_int **)&local_170.super_t_doc.doc_._M_string_length) {
        operator_delete(local_170.super_t_doc._vptr_t_doc);
      }
      if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
        operator_delete((void *)local_4d0._0_8_);
      }
      t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)os);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                );
      ptVar10 = *pptVar9;
      if (ptVar10->oneway_ == false) {
        local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
        pcVar3 = (ptVar10->name_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4f0,pcVar3,pcVar3 + (ptVar10->name_)._M_string_length);
        std::__cxx11::string::append((char *)&local_4f0);
        local_470 = (this->super_t_oop_generator).super_t_generator.program_;
        local_4d0._8_8_ = &aStack_4b8;
        local_4d0._16_8_ = (undefined *)0x0;
        aStack_4b8._0_8_ = aStack_4b8._0_8_ & 0xffffffffffffff00;
        local_4a8 = false;
        local_498._M_color = _S_red;
        local_498._M_parent = (_Base_ptr)0x0;
        local_498._M_left = &local_498;
        local_478 = 0;
        local_468._M_p = (pointer)&local_458;
        local_460 = 0;
        local_458._M_local_buf[0] = '\0';
        local_4d0._0_8_ = &PTR__t_struct_0040eeb8;
        local_414 = 0;
        local_410 = false;
        local_428 = (pointer)0x0;
        uStack_420 = 0;
        uStack_419 = 0;
        local_438 = (pointer)0x0;
        pptStack_430 = (pointer)0x0;
        local_448 = (pointer)0x0;
        pptStack_440 = (pointer)0x0;
        local_538 = (t_struct *)(*pptVar9)->returntype_;
        local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
        local_498._M_right = local_498._M_left;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"recv_","");
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_558,(ulong)((*pptVar9)->name_)._M_dataplus._M_p);
        local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
        psVar12 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_388.field_2._M_allocated_capacity = *psVar12;
          local_388.field_2._8_8_ = plVar7[3];
        }
        else {
          local_388.field_2._M_allocated_capacity = *psVar12;
          local_388._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_388._M_string_length = plVar7[1];
        *plVar7 = (long)psVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        t_function::t_function
                  (&local_170,&local_538->super_t_type,&local_388,(t_struct *)local_4d0,
                   (*pptVar9)->xceptions_,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p != &local_388.field_2) {
          operator_delete(local_388._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_558._M_dataplus._M_p != &local_558.field_2) {
          operator_delete(local_558._M_dataplus._M_p);
        }
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"public ",7);
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"");
        function_signature(&local_558,this,&local_170,&local_1b0);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_558._M_dataplus._M_p,local_558._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_558._M_dataplus._M_p != &local_558.field_2) {
          operator_delete(local_558._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p);
        }
        t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)os);
        t_generator::indent_abi_cxx11_(&local_558,(t_generator *)this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)os,local_558._M_dataplus._M_p,local_558._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"TMessage msg = iprot_.readMessageBegin();",0x29);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_510,(t_generator *)this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_510._M_dataplus._M_p,local_510._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"if (msg.type == TMessageType.EXCEPTION) {",0x29);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_530,(t_generator *)this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_530._M_dataplus._M_p,local_530._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"  TApplicationException x = TApplicationException.read(iprot_);",0x3f);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_408,(t_generator *)this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_408._M_dataplus._M_p,local_408._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  iprot_.readMessageEnd();",0x1a)
        ;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_1d0,(t_generator *)this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  throw x;",10);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_210,(t_generator *)this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_210._M_dataplus._M_p,local_210._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if (msg.seqid != seqid_) {",0x1a)
        ;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_230,(t_generator *)this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_230._M_dataplus._M_p,local_230._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   "  throw new TApplicationException(TApplicationException.BAD_SEQUENCE_ID, \"",
                   0x4a);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,((*pptVar9)->name_)._M_dataplus._M_p,
                            ((*pptVar9)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8," failed: out of sequence response\");",0x24);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_250,(t_generator *)this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_250._M_dataplus._M_p,local_250._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_270,(t_generator *)this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_270._M_dataplus._M_p,local_270._M_string_length);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," result = new ",0xe);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"();",3);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_290,(t_generator *)this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_290._M_dataplus._M_p,local_290._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"result.read(iprot_);",0x14);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_2b0,(t_generator *)this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"iprot_.readMessageEnd();",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._M_dataplus._M_p != &local_530.field_2) {
          operator_delete(local_530._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_510._M_dataplus._M_p != &local_510.field_2) {
          operator_delete(local_510._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_558._M_dataplus._M_p != &local_558.field_2) {
          operator_delete(local_558._M_dataplus._M_p);
        }
        iVar6 = (*((*pptVar9)->returntype_->super_t_doc)._vptr_t_doc[4])();
        if ((char)iVar6 == '\0') {
          t_generator::indent_abi_cxx11_(&local_558,(t_generator *)this);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)os,local_558._M_dataplus._M_p,local_558._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if (result.",0xb);
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          this_00 = (t_javame_generator *)0x3a4e44;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"success","");
          generate_isset_check(&local_510,this_00,&local_2d0);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_510._M_dataplus._M_p,local_510._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,") {",3);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_530,(t_generator *)this);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_530._M_dataplus._M_p,local_530._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  return result.success;",0x18)
          ;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_408,(t_generator *)this);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_408._M_dataplus._M_p,local_408._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != &local_408.field_2) {
            operator_delete(local_408._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_530._M_dataplus._M_p != &local_530.field_2) {
            operator_delete(local_530._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_510._M_dataplus._M_p != &local_510.field_2) {
            operator_delete(local_510._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_558._M_dataplus._M_p != &local_558.field_2) {
            operator_delete(local_558._M_dataplus._M_p);
          }
        }
        ptVar10 = *pptVar9;
        ptVar4 = ptVar10->xceptions_;
        pptVar14 = (ptVar4->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        if (pptVar14 !=
            (ptVar4->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            t_generator::indent_abi_cxx11_(&local_558,(t_generator *)this);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)os,local_558._M_dataplus._M_p,local_558._M_string_length)
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if (result.",0xb);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,((*pptVar14)->name_)._M_dataplus._M_p,
                                ((*pptVar14)->name_)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," != null) {",0xb);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                                ::endl_abi_cxx11_._M_string_length);
            t_generator::indent_abi_cxx11_(&local_510,(t_generator *)this);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,local_510._M_dataplus._M_p,local_510._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  throw result.",0xf);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,((*pptVar14)->name_)._M_dataplus._M_p,
                                ((*pptVar14)->name_)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,";",1);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                                ::endl_abi_cxx11_._M_string_length);
            t_generator::indent_abi_cxx11_(&local_530,(t_generator *)this);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,local_530._M_dataplus._M_p,local_530._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_530._M_dataplus._M_p != &local_530.field_2) {
              operator_delete(local_530._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_510._M_dataplus._M_p != &local_510.field_2) {
              operator_delete(local_510._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_558._M_dataplus._M_p != &local_558.field_2) {
              operator_delete(local_558._M_dataplus._M_p);
            }
            pptVar14 = pptVar14 + 1;
          } while (pptVar14 !=
                   (ptVar4->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
          ptVar10 = *pptVar9;
        }
        iVar6 = (*(ptVar10->returntype_->super_t_doc)._vptr_t_doc[4])();
        if ((char)iVar6 == '\0') {
          t_generator::indent_abi_cxx11_(&local_558,(t_generator *)this);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)os,local_558._M_dataplus._M_p,local_558._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,
                     "throw new TApplicationException(TApplicationException.MISSING_RESULT, \"",0x47
                    );
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,((*pptVar9)->name_)._M_dataplus._M_p,
                              ((*pptVar9)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," failed: unknown result\");",0x1a);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_558._M_dataplus._M_p != &local_558.field_2) {
            operator_delete(local_558._M_dataplus._M_p);
          }
        }
        else {
          poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return;",7);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)os);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,
                   ::endl_abi_cxx11_._M_string_length);
        t_function::~t_function(&local_170);
        local_4d0._0_8_ = &PTR__t_struct_0040eeb8;
        if (pptStack_430 != (pointer)0x0) {
          operator_delete(pptStack_430);
        }
        if (local_448 != (pointer)0x0) {
          operator_delete(local_448);
        }
        t_type::~t_type((t_type *)local_4d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
          operator_delete(local_4f0._M_dataplus._M_p);
        }
      }
      if (local_3e8 != local_3d8) {
        operator_delete(local_3e8);
      }
      t_function::~t_function(&local_d0);
      if (local_3c8 != local_3b8) {
        operator_delete(local_3c8);
      }
      pptVar9 = pptVar9 + 1;
    } while (pptVar9 !=
             local_2e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_2e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_308 != local_2f8) {
    operator_delete(local_308);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_javame_generator::generate_service_client(t_service* tservice) {
  string extends = "";
  string extends_client = "";
  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends());
    extends_client = " extends " + extends + ".Client";
  }

  indent(f_service_) << "public static class Client" << extends_client
                     << " implements TServiceClient, Iface {" << endl;
  indent_up();

  indent(f_service_) << "public Client(TProtocol prot)" << endl;
  scope_up(f_service_);
  indent(f_service_) << "this(prot, prot);" << endl;
  scope_down(f_service_);
  f_service_ << endl;

  indent(f_service_) << "public Client(TProtocol iprot, TProtocol oprot)" << endl;
  scope_up(f_service_);
  if (extends.empty()) {
    f_service_ << indent() << "iprot_ = iprot;" << endl << indent() << "oprot_ = oprot;" << endl;
  } else {
    f_service_ << indent() << "super(iprot, oprot);" << endl;
  }
  scope_down(f_service_);
  f_service_ << endl;

  if (extends.empty()) {
    f_service_ << indent() << "protected TProtocol iprot_;" << endl << indent()
               << "protected TProtocol oprot_;" << endl << endl << indent()
               << "protected int seqid_;" << endl << endl;

    indent(f_service_) << "public TProtocol getInputProtocol()" << endl;
    scope_up(f_service_);
    indent(f_service_) << "return this.iprot_;" << endl;
    scope_down(f_service_);
    f_service_ << endl;

    indent(f_service_) << "public TProtocol getOutputProtocol()" << endl;
    scope_up(f_service_);
    indent(f_service_) << "return this.oprot_;" << endl;
    scope_down(f_service_);
    f_service_ << endl;
  }

  // Generate client method implementations
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    string funname = (*f_iter)->get_name();

    // Open function
    indent(f_service_) << "public " << function_signature(*f_iter) << endl;
    scope_up(f_service_);
    indent(f_service_) << "send_" << funname << "(";

    // Get the struct of function call params
    t_struct* arg_struct = (*f_iter)->get_arglist();

    // Declare the function arguments
    const vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator fld_iter;
    bool first = true;
    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      if (first) {
        first = false;
      } else {
        f_service_ << ", ";
      }
      f_service_ << (*fld_iter)->get_name();
    }
    f_service_ << ");" << endl;

    if (!(*f_iter)->is_oneway()) {
      f_service_ << indent();
      if (!(*f_iter)->get_returntype()->is_void()) {
        f_service_ << "return ";
      }
      f_service_ << "recv_" << funname << "();" << endl;
    }
    scope_down(f_service_);
    f_service_ << endl;

    t_function send_function(g_type_void,
                             string("send_") + (*f_iter)->get_name(),
                             (*f_iter)->get_arglist());

    string argsname = (*f_iter)->get_name() + "_args";

    // Open function
    indent(f_service_) << "public " << function_signature(&send_function) << endl;
    scope_up(f_service_);

    // Serialize the request
    f_service_ << indent() << "oprot_.writeMessageBegin(new TMessage(\"" << funname << "\", "
               << ((*f_iter)->is_oneway() ? "TMessageType.ONEWAY" : "TMessageType.CALL")
               << ", ++seqid_));" << endl << indent() << argsname << " args = new " << argsname
               << "();" << endl;

    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      f_service_ << indent() << "args.set" << get_cap_name((*fld_iter)->get_name()) << "("
                 << (*fld_iter)->get_name() << ");" << endl;
    }

    f_service_ << indent() << "args.write(oprot_);" << endl << indent()
               << "oprot_.writeMessageEnd();" << endl << indent()
               << "oprot_.getTransport().flush();" << endl;

    scope_down(f_service_);
    f_service_ << endl;

    if (!(*f_iter)->is_oneway()) {
      string resultname = (*f_iter)->get_name() + "_result";

      t_struct noargs(program_);
      t_function recv_function((*f_iter)->get_returntype(),
                               string("recv_") + (*f_iter)->get_name(),
                               &noargs,
                               (*f_iter)->get_xceptions());
      // Open function
      indent(f_service_) << "public " << function_signature(&recv_function) << endl;
      scope_up(f_service_);

      f_service_ << indent() << "TMessage msg = iprot_.readMessageBegin();" << endl << indent()
                 << "if (msg.type == TMessageType.EXCEPTION) {" << endl << indent()
                 << "  TApplicationException x = TApplicationException.read(iprot_);" << endl
                 << indent() << "  iprot_.readMessageEnd();" << endl << indent() << "  throw x;"
                 << endl << indent() << "}" << endl << indent() << "if (msg.seqid != seqid_) {"
                 << endl << indent()
                 << "  throw new TApplicationException(TApplicationException.BAD_SEQUENCE_ID, \""
                 << (*f_iter)->get_name() << " failed: out of sequence response\");" << endl
                 << indent() << "}" << endl << indent() << resultname << " result = new "
                 << resultname << "();" << endl << indent() << "result.read(iprot_);" << endl
                 << indent() << "iprot_.readMessageEnd();" << endl;

      // Careful, only return _result if not a void function
      if (!(*f_iter)->get_returntype()->is_void()) {
        f_service_ << indent() << "if (result." << generate_isset_check("success") << ") {" << endl
                   << indent() << "  return result.success;" << endl << indent() << "}" << endl;
      }

      t_struct* xs = (*f_iter)->get_xceptions();
      const std::vector<t_field*>& xceptions = xs->get_members();
      vector<t_field*>::const_iterator x_iter;
      for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
        f_service_ << indent() << "if (result." << (*x_iter)->get_name() << " != null) {" << endl
                   << indent() << "  throw result." << (*x_iter)->get_name() << ";" << endl
                   << indent() << "}" << endl;
      }

      // If you get here it's an exception, unless a void function
      if ((*f_iter)->get_returntype()->is_void()) {
        indent(f_service_) << "return;" << endl;
      } else {
        f_service_ << indent()
                   << "throw new TApplicationException(TApplicationException.MISSING_RESULT, \""
                   << (*f_iter)->get_name() << " failed: unknown result\");" << endl;
      }

      // Close function
      scope_down(f_service_);
      f_service_ << endl;
    }
  }

  indent_down();
  indent(f_service_) << "}" << endl;
}